

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivfdec.c
# Opt level: O3

int ivf_read_frame(AvxInputContext *input_ctx,uint8_t **buffer,size_t *bytes_read,
                  size_t *buffer_size,aom_codec_pts_t *pts)

{
  _Bool _Var1;
  size_t sVar2;
  uint8_t *puVar3;
  size_t sVar4;
  int iVar5;
  uchar raw_header [12];
  uint local_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  local_38 = 0;
  local_40 = 0;
  uStack_3c = 0;
  sVar2 = read_from_input(input_ctx,0xc,(uchar *)&local_40);
  if (sVar2 == 0xc) {
    sVar2 = (size_t)local_40;
    if (sVar2 < 0x10000001) {
      if (*buffer_size < sVar2) {
        puVar3 = (uint8_t *)realloc(*buffer,sVar2 * 2);
        if (puVar3 == (uint8_t *)0x0) {
          ivf_read_frame_cold_2();
          sVar2 = 0;
        }
        else {
          *buffer = puVar3;
          *buffer_size = sVar2 * 2;
        }
      }
    }
    else {
      fprintf(_stderr,"Warning: Read invalid frame size (%u)\n",sVar2);
      sVar2 = 0;
    }
    if (pts != (aom_codec_pts_t *)0x0) {
      *pts = CONCAT44(local_38,uStack_3c);
    }
  }
  else {
    _Var1 = input_eof(input_ctx);
    if (!_Var1) {
      ivf_read_frame_cold_1();
    }
    sVar2 = 0;
  }
  _Var1 = input_eof(input_ctx);
  iVar5 = 1;
  if (!_Var1) {
    sVar4 = read_from_input(input_ctx,sVar2,*buffer);
    if (sVar4 == sVar2) {
      *bytes_read = sVar2;
      iVar5 = 0;
    }
    else {
      ivf_read_frame_cold_3();
    }
  }
  return iVar5;
}

Assistant:

int ivf_read_frame(struct AvxInputContext *input_ctx, uint8_t **buffer,
                   size_t *bytes_read, size_t *buffer_size,
                   aom_codec_pts_t *pts) {
  unsigned char raw_header[IVF_FRAME_HDR_SZ] = { 0 };
  size_t frame_size = 0;

  if (read_from_input(input_ctx, IVF_FRAME_HDR_SZ, raw_header) !=
      IVF_FRAME_HDR_SZ) {
    if (!input_eof(input_ctx))
      fprintf(stderr, "Warning: Failed to read frame size\n");
  } else {
    frame_size = mem_get_le32(raw_header);

    if (frame_size > 256 * 1024 * 1024) {
      fprintf(stderr, "Warning: Read invalid frame size (%u)\n",
              (unsigned int)frame_size);
      frame_size = 0;
    }

    if (frame_size > *buffer_size) {
      uint8_t *new_buffer = (uint8_t *)realloc(*buffer, 2 * frame_size);

      if (new_buffer) {
        *buffer = new_buffer;
        *buffer_size = 2 * frame_size;
      } else {
        fprintf(stderr, "Warning: Failed to allocate compressed data buffer\n");
        frame_size = 0;
      }
    }

    if (pts) {
      *pts = mem_get_le32(&raw_header[4]);
      *pts += ((aom_codec_pts_t)mem_get_le32(&raw_header[8]) << 32);
    }
  }

  if (!input_eof(input_ctx)) {
    ASAN_UNPOISON_MEMORY_REGION(*buffer, *buffer_size);
    if (read_from_input(input_ctx, frame_size, *buffer) != frame_size) {
      fprintf(stderr, "Warning: Failed to read full frame\n");
      return 1;
    }

    ASAN_POISON_MEMORY_REGION(*buffer + frame_size, *buffer_size - frame_size);
    *bytes_read = frame_size;
    return 0;
  }

  return 1;
}